

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void __thiscall
httplib::detail::MultipartFormDataParser::buf_append
          (MultipartFormDataParser *this,char *data,size_t n)

{
  pointer pcVar1;
  size_t i;
  size_t sVar2;
  size_t sVar3;
  
  sVar3 = this->buf_epos_ - this->buf_spos_;
  if (this->buf_spos_ != 0 && sVar3 != 0) {
    sVar2 = 0;
    do {
      pcVar1 = (this->buf_)._M_dataplus._M_p;
      pcVar1[sVar2] = pcVar1[this->buf_spos_ + sVar2];
      sVar2 = sVar2 + 1;
    } while (sVar3 != sVar2);
  }
  this->buf_spos_ = 0;
  this->buf_epos_ = sVar3;
  if ((this->buf_)._M_string_length < sVar3 + n) {
    std::__cxx11::string::resize((ulong)&this->buf_,(char)(sVar3 + n));
  }
  if (n != 0) {
    sVar3 = 0;
    do {
      (this->buf_)._M_dataplus._M_p[sVar3 + this->buf_epos_] = data[sVar3];
      sVar3 = sVar3 + 1;
    } while (n != sVar3);
  }
  this->buf_epos_ = this->buf_epos_ + n;
  return;
}

Assistant:

void buf_append(const char *data, size_t n) {
    auto remaining_size = buf_size();
    if (remaining_size > 0 && buf_spos_ > 0) {
      for (size_t i = 0; i < remaining_size; i++) {
        buf_[i] = buf_[buf_spos_ + i];
      }
    }
    buf_spos_ = 0;
    buf_epos_ = remaining_size;

    if (remaining_size + n > buf_.size()) { buf_.resize(remaining_size + n); }

    for (size_t i = 0; i < n; i++) {
      buf_[buf_epos_ + i] = data[i];
    }
    buf_epos_ += n;
  }